

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

bool arm::is_valid_immediate(uint32_t val)

{
  uint32_t uVar1;
  uint in_EDI;
  double dVar2;
  int highest_bit_1;
  int highest_bit;
  bool local_19;
  bool local_11;
  bool local_1;
  
  if (in_EDI < 0x100) {
    local_1 = true;
  }
  else if (in_EDI < 0x1000000) {
    dVar2 = log2((double)(in_EDI & -in_EDI));
    local_11 = (in_EDI & (0xff << ((byte)(int)(dVar2 + 1.0) & 0x1f) ^ 0xffffffffU)) == 0 &&
               (int)(dVar2 + 1.0) % 2 == 0;
    local_1 = local_11;
  }
  else {
    uVar1 = prelude::rotl32(in_EDI,8);
    dVar2 = log2((double)(uVar1 & -uVar1));
    local_19 = (uVar1 & (0xff << ((byte)(int)(dVar2 + 1.0) & 0x1f) ^ 0xffffffffU)) == 0 &&
               (int)(dVar2 + 1.0) % 2 == 0;
    local_1 = local_19;
  }
  return local_1;
}

Assistant:

bool is_valid_immediate(uint32_t val) {
  if (val <= 0xff)
    return true;
  else if (val <= 0x00ffffff) {
    int highest_bit = log2(val & -val) + 1;
    return (val & ~(0xff << highest_bit)) == 0 && highest_bit % 2 == 0;
  } else {
    val = prelude::rotl32(val, 8);
    int highest_bit = log2(val & -val) + 1;
    return (val & ~(0xff << highest_bit)) == 0 && highest_bit % 2 == 0;
  }
}